

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O3

CURLcode Curl_vsetopt(Curl_easy *data,CURLoption option,__va_list_tag *param)

{
  undefined1 *puVar1;
  curl_slist *pcVar2;
  curl_blob *blob;
  Curl_share *pCVar3;
  FILE *pFVar4;
  char *pcVar5;
  curl_read_callback p_Var6;
  _Bool _Var7;
  byte bVar8;
  ushort uVar9;
  unsigned_short uVar10;
  uint uVar11;
  CURLoption CVar12;
  ulong *puVar13;
  long *plVar14;
  undefined8 *puVar15;
  Curl_share *pCVar16;
  altsvcinfo *asi;
  ulong uVar17;
  code *pcVar18;
  hsts *phVar19;
  byte bVar20;
  ushort uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  curl_progress_callback p_Var25;
  PslCache *pPVar26;
  ssl_config_data *psVar27;
  hsts **hp;
  CURLcode CVar28;
  curl_off_t *pcVar29;
  
  if (9999 < option) {
    if (option < 20000) {
      if ((int)option < 0x2778) {
        uVar17 = (ulong)(option - CURLOPT_HTTPHEADER);
        if (option - CURLOPT_HTTPHEADER < 0x30) {
          if ((0x800000010021U >> (uVar17 & 0x3f) & 1) != 0) goto LAB_00151bd4;
          if (uVar17 == 1) {
            uVar11 = param->gp_offset;
            if ((ulong)uVar11 < 0x29) {
              puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
              param->gp_offset = uVar11 + 8;
            }
            else {
              puVar15 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar15 + 1;
            }
            (data->set).httppost = (curl_httppost *)*puVar15;
            (data->set).method = '\x02';
            goto LAB_0015231c;
          }
          if (uVar17 == 0xe) {
            uVar11 = param->gp_offset;
            if ((ulong)uVar11 < 0x29) {
              plVar14 = (long *)((ulong)uVar11 + (long)param->reg_save_area);
              param->gp_offset = uVar11 + 8;
            }
            else {
              plVar14 = (long *)param->overflow_arg_area;
              param->overflow_arg_area = plVar14 + 1;
            }
            pFVar4 = (FILE *)*plVar14;
            (data->set).err = pFVar4;
            if (pFVar4 == (FILE *)0x0) {
              (data->set).err = _stderr;
              return CURLE_OK;
            }
            return CURLE_OK;
          }
        }
        if (option != CURLOPT_PREQUOTE) {
          if (option == CURLOPT_SHARE) {
            uVar11 = param->gp_offset;
            if ((ulong)uVar11 < 0x29) {
              plVar14 = (long *)((ulong)uVar11 + (long)param->reg_save_area);
              param->gp_offset = uVar11 + 8;
            }
            else {
              plVar14 = (long *)param->overflow_arg_area;
              param->overflow_arg_area = plVar14 + 1;
            }
            pCVar16 = (Curl_share *)*plVar14;
            if (data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
              pCVar3 = data->share;
              if (pCVar3->cookies == data->cookies) {
                data->cookies = (CookieInfo *)0x0;
              }
              if (pCVar3->hsts == data->hsts) {
                data->hsts = (hsts *)0x0;
              }
              if (data->psl == &pCVar3->psl) {
                pPVar26 = &data->multi->psl;
                if (data->multi == (Curl_multi *)0x0) {
                  pPVar26 = (PslCache *)0x0;
                }
                data->psl = pPVar26;
              }
              pCVar3->dirty = pCVar3->dirty - 1;
              Curl_share_unlock(data,CURL_LOCK_DATA_SHARE);
              data->share = (Curl_share *)0x0;
            }
            if (pCVar16 != (Curl_share *)0x0) {
              if (pCVar16->magic == 0x7e117a1e) {
                data->share = pCVar16;
                Curl_share_lock(data,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
                pCVar16 = data->share;
                pCVar16->dirty = pCVar16->dirty + 1;
                if (pCVar16->cookies != (CookieInfo *)0x0) {
                  Curl_cookie_cleanup(data->cookies);
                  pCVar16 = data->share;
                  data->cookies = pCVar16->cookies;
                }
                if (pCVar16->hsts != (hsts *)0x0) {
                  Curl_hsts_cleanup(&data->hsts);
                  pCVar16 = data->share;
                  data->hsts = pCVar16->hsts;
                }
                if ((pCVar16->specifier & 0x40) != 0) {
                  data->psl = &pCVar16->psl;
                }
                Curl_share_unlock(data,CURL_LOCK_DATA_SHARE);
                return CURLE_OK;
              }
              return CURLE_OK;
            }
            return CURLE_OK;
          }
LAB_00151d7b:
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          CVar28 = setopt_cptr(data,option,(char *)*puVar15);
          return CVar28;
        }
      }
      else {
        uVar11 = option - CURLOPT_MAIL_RCPT;
        if (uVar11 < 0x39) {
          if ((0x100020000010001U >> ((ulong)uVar11 & 0x3f) & 1) != 0) goto LAB_00151bd4;
          if ((0x60000000000000U >> ((ulong)uVar11 & 0x3f) & 1) != 0) {
            return CURLE_UNKNOWN_OPTION;
          }
        }
        if (option == CURLOPT_MIMEPOST) {
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          CVar28 = Curl_mime_set_subparts(&(data->set).mimepost,(curl_mime *)*puVar15,0);
          if (CVar28 != CURLE_OK) {
            return CVar28;
          }
          (data->set).method = '\x03';
LAB_0015231c:
          puVar1 = &(data->set).field_0x897;
          *puVar1 = *puVar1 & 0xdf;
          Curl_mime_cleanpart((data->state).formp);
          (*Curl_cfree)((data->state).formp);
          (data->state).mimepost = (curl_mimepart *)0x0;
          (data->state).formp = (curl_mimepart *)0x0;
          goto switchD_00151aed_caseD_5b;
        }
        if (option != CURLOPT_HTTP200ALIASES) goto LAB_00151d7b;
      }
LAB_00151bd4:
      uVar11 = param->gp_offset;
      if ((ulong)uVar11 < 0x29) {
        puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
        param->gp_offset = uVar11 + 8;
      }
      else {
        puVar15 = (undefined8 *)param->overflow_arg_area;
        param->overflow_arg_area = puVar15 + 1;
      }
      pcVar2 = (curl_slist *)*puVar15;
      if ((int)option < 0x2778) {
        if ((int)option < 0x2737) {
          if (option == CURLOPT_HTTPHEADER) {
            lVar22 = 0x300;
          }
          else {
            if (option != CURLOPT_QUOTE) {
              return CURLE_UNKNOWN_OPTION;
            }
            lVar22 = 0x6b8;
          }
        }
        else if (option == CURLOPT_POSTQUOTE) {
          lVar22 = 0x6c0;
        }
        else if (option == CURLOPT_TELNETOPTIONS) {
          lVar22 = 0x4c8;
        }
        else {
          if (option != CURLOPT_PREQUOTE) {
            return CURLE_UNKNOWN_OPTION;
          }
          lVar22 = 0x6c8;
        }
      }
      else if ((int)option < 0x27db) {
        if (option == CURLOPT_HTTP200ALIASES) {
          lVar22 = 0x6a0;
        }
        else {
          if (option != CURLOPT_MAIL_RCPT) {
            return CURLE_UNKNOWN_OPTION;
          }
          lVar22 = 0xa18;
        }
      }
      else if (option == CURLOPT_RESOLVE) {
        (data->set).resolve = pcVar2;
        lVar22 = 0x1240;
      }
      else {
        lVar22 = 0x678;
        if (option != CURLOPT_PROXYHEADER) {
          if (option != CURLOPT_CONNECT_TO) {
            return CURLE_UNKNOWN_OPTION;
          }
          lVar22 = 0x4d8;
        }
      }
      *(curl_slist **)((long)&data->magic + lVar22) = pcVar2;
      goto switchD_00151aed_caseD_5b;
    }
    if (option < 30000) {
      CVar28 = CURLE_UNKNOWN_OPTION;
      if ((int)option < 0x4ee4) {
        if ((int)option < 0x4e8c) {
          if ((int)option < 0x4e58) {
            if (option == CURLOPT_WRITEFUNCTION) {
              uVar11 = param->gp_offset;
              if ((ulong)uVar11 < 0x29) {
                plVar14 = (long *)((ulong)uVar11 + (long)param->reg_save_area);
                param->gp_offset = uVar11 + 8;
              }
              else {
                plVar14 = (long *)param->overflow_arg_area;
                param->overflow_arg_area = plVar14 + 1;
              }
              pcVar18 = (code *)*plVar14;
              if (pcVar18 == (curl_write_callback)0x0) {
                pcVar18 = fwrite;
              }
              (data->set).fwrite_func = pcVar18;
            }
            else {
              if (option != CURLOPT_READFUNCTION) {
                return CURLE_UNKNOWN_OPTION;
              }
              uVar11 = param->gp_offset;
              if ((ulong)uVar11 < 0x29) {
                plVar14 = (long *)((ulong)uVar11 + (long)param->reg_save_area);
                param->gp_offset = uVar11 + 8;
              }
              else {
                plVar14 = (long *)param->overflow_arg_area;
                param->overflow_arg_area = plVar14 + 1;
              }
              p_Var6 = (curl_read_callback)*plVar14;
              (data->set).fread_func_set = p_Var6;
              uVar17 = *(ulong *)&(data->set).field_0x894;
              if (p_Var6 != (curl_read_callback)0x0) {
                uVar17 = uVar17 | 0x10;
                goto LAB_001534f6;
              }
              *(ulong *)&(data->set).field_0x894 = uVar17 & 0xffffffffffffffef;
              (data->set).fread_func_set = fread;
            }
          }
          else {
            if (option == CURLOPT_PROGRESSFUNCTION) {
              uVar11 = param->gp_offset;
              if ((ulong)uVar11 < 0x29) {
                plVar14 = (long *)((ulong)uVar11 + (long)param->reg_save_area);
                param->gp_offset = uVar11 + 8;
              }
              else {
                plVar14 = (long *)param->overflow_arg_area;
                param->overflow_arg_area = plVar14 + 1;
              }
              p_Var25 = (curl_progress_callback)*plVar14;
              (data->set).fprogress = p_Var25;
              goto LAB_00153590;
            }
            if (option == CURLOPT_HEADERFUNCTION) {
              uVar11 = param->gp_offset;
              if ((ulong)uVar11 < 0x29) {
                puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
                param->gp_offset = uVar11 + 8;
              }
              else {
                puVar15 = (undefined8 *)param->overflow_arg_area;
                param->overflow_arg_area = puVar15 + 1;
              }
              (data->set).fwrite_header = (curl_write_callback)*puVar15;
            }
            else {
              if (option != CURLOPT_DEBUGFUNCTION) {
                return CURLE_UNKNOWN_OPTION;
              }
              uVar11 = param->gp_offset;
              if ((ulong)uVar11 < 0x29) {
                puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
                param->gp_offset = uVar11 + 8;
              }
              else {
                puVar15 = (undefined8 *)param->overflow_arg_area;
                param->overflow_arg_area = puVar15 + 1;
              }
              (data->set).fdebug = (curl_debug_callback)*puVar15;
            }
          }
        }
        else if ((int)option < 0x4eb4) {
          if (option == CURLOPT_SSL_CTX_FUNCTION) {
            _Var7 = Curl_ssl_supports(data,8);
            if (!_Var7) {
              return CURLE_NOT_BUILT_IN;
            }
            uVar11 = param->gp_offset;
            if ((ulong)uVar11 < 0x29) {
              puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
              param->gp_offset = uVar11 + 8;
            }
            else {
              puVar15 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar15 + 1;
            }
            (data->set).ssl.fsslctx = (curl_ssl_ctx_callback)*puVar15;
          }
          else {
            if (option != CURLOPT_IOCTLFUNCTION) {
              return CURLE_UNKNOWN_OPTION;
            }
            uVar11 = param->gp_offset;
            if ((ulong)uVar11 < 0x29) {
              puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
              param->gp_offset = uVar11 + 8;
            }
            else {
              puVar15 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar15 + 1;
            }
            (data->set).ioctl_func = (curl_ioctl_callback)*puVar15;
          }
        }
        else if (option == CURLOPT_SOCKOPTFUNCTION) {
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          (data->set).fsockopt = (curl_sockopt_callback)*puVar15;
        }
        else if (option == CURLOPT_OPENSOCKETFUNCTION) {
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          (data->set).fopensocket = (curl_opensocket_callback)*puVar15;
        }
        else {
          if (option != CURLOPT_SEEKFUNCTION) {
            return CURLE_UNKNOWN_OPTION;
          }
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          (data->set).seek_func = (curl_seek_callback)*puVar15;
        }
      }
      else if ((int)option < 0x4f30) {
        switch(option) {
        case CURLOPT_INTERLEAVEFUNCTION:
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          (data->set).fwrite_rtp = (curl_write_callback)*puVar15;
          break;
        case 0x4ee5:
          goto switchD_00151aed_caseD_ef;
        case CURLOPT_CHUNK_BGN_FUNCTION:
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          (data->set).chunk_bgn = (curl_chunk_bgn_callback)*puVar15;
          break;
        case CURLOPT_CHUNK_END_FUNCTION:
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          (data->set).chunk_end = (curl_chunk_end_callback)*puVar15;
          break;
        case CURLOPT_FNMATCH_FUNCTION:
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          (data->set).fnmatch = (curl_fnmatch_callback)*puVar15;
          break;
        default:
          if (option == CURLOPT_CLOSESOCKETFUNCTION) {
            uVar11 = param->gp_offset;
            if ((ulong)uVar11 < 0x29) {
              puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
              param->gp_offset = uVar11 + 8;
            }
            else {
              puVar15 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar15 + 1;
            }
            (data->set).fclosesocket = (curl_closesocket_callback)*puVar15;
          }
          else {
            if (option != CURLOPT_XFERINFOFUNCTION) {
              return CURLE_UNKNOWN_OPTION;
            }
            uVar11 = param->gp_offset;
            if ((ulong)uVar11 < 0x29) {
              plVar14 = (long *)((ulong)uVar11 + (long)param->reg_save_area);
              param->gp_offset = uVar11 + 8;
            }
            else {
              plVar14 = (long *)param->overflow_arg_area;
              param->overflow_arg_area = plVar14 + 1;
            }
            p_Var25 = (curl_progress_callback)*plVar14;
            (data->set).fxferinfo = (curl_xferinfo_callback)p_Var25;
LAB_00153590:
            bVar8 = (data->progress).field_0x1ac;
            if (p_Var25 == (curl_progress_callback)0x0) {
              bVar8 = bVar8 & 0xfe;
            }
            else {
              bVar8 = bVar8 | 1;
            }
            (data->progress).field_0x1ac = bVar8;
          }
        }
      }
      else if ((int)option < 0x4f4d) {
        if (option == CURLOPT_RESOLVER_START_FUNCTION) {
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          (data->set).resolver_start = (curl_resolver_start_callback)*puVar15;
        }
        else {
          if (option != CURLOPT_TRAILERFUNCTION) {
            return CURLE_UNKNOWN_OPTION;
          }
          uVar11 = param->gp_offset;
          if ((ulong)uVar11 < 0x29) {
            puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
            param->gp_offset = uVar11 + 8;
          }
          else {
            puVar15 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar15 + 1;
          }
          (data->set).trailer_callback = (curl_trailer_callback)*puVar15;
        }
      }
      else if (option == CURLOPT_HSTSREADFUNCTION) {
        uVar11 = param->gp_offset;
        if ((ulong)uVar11 < 0x29) {
          puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
          param->gp_offset = uVar11 + 8;
        }
        else {
          puVar15 = (undefined8 *)param->overflow_arg_area;
          param->overflow_arg_area = puVar15 + 1;
        }
        (data->set).hsts_read = (curl_hstsread_callback)*puVar15;
      }
      else if (option == CURLOPT_HSTSWRITEFUNCTION) {
        uVar11 = param->gp_offset;
        if ((ulong)uVar11 < 0x29) {
          puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
          param->gp_offset = uVar11 + 8;
        }
        else {
          puVar15 = (undefined8 *)param->overflow_arg_area;
          param->overflow_arg_area = puVar15 + 1;
        }
        (data->set).hsts_write = (curl_hstswrite_callback)*puVar15;
      }
      else {
        if (option != CURLOPT_PREREQFUNCTION) {
          return CURLE_UNKNOWN_OPTION;
        }
        uVar11 = param->gp_offset;
        if ((ulong)uVar11 < 0x29) {
          puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
          param->gp_offset = uVar11 + 8;
        }
        else {
          puVar15 = (undefined8 *)param->overflow_arg_area;
          param->overflow_arg_area = puVar15 + 1;
        }
        (data->set).fprereq = (curl_prereq_callback)*puVar15;
      }
      goto switchD_00151aed_caseD_5b;
    }
    uVar11 = param->gp_offset;
    if (option < 40000) {
      if (uVar11 < 0x29) {
        plVar14 = (long *)((ulong)uVar11 + (long)param->reg_save_area);
        param->gp_offset = uVar11 + 8;
      }
      else {
        plVar14 = (long *)param->overflow_arg_area;
        param->overflow_arg_area = plVar14 + 1;
      }
      lVar22 = *plVar14;
      CVar12 = option & 0xffff;
      CVar28 = CURLE_UNKNOWN_OPTION;
      if (CVar12 < CURLOPT_MAX_SEND_SPEED_LARGE) {
        switch(CVar12) {
        case CURLOPT_INFILESIZE_LARGE:
          if (lVar22 < -1) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          pcVar29 = &(data->set).filesize;
          break;
        case CURLOPT_RESUME_FROM_LARGE:
          if (lVar22 < -1) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          pcVar29 = &(data->set).set_resume_from;
          break;
        case CURLOPT_MAXFILESIZE_LARGE:
          if (lVar22 < 0) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          pcVar29 = &(data->set).max_filesize;
          break;
        default:
          goto switchD_00151aed_caseD_ef;
        case CURLOPT_POSTFIELDSIZE_LARGE:
          if (lVar22 < -1) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          pcVar29 = &(data->set).postfieldsize;
          if (((data->set).postfieldsize < lVar22) &&
             (pcVar5 = (data->set).str[0x49], (char *)(data->set).postfields == pcVar5)) {
            (*Curl_cfree)(pcVar5);
            (data->set).str[0x49] = (char *)0x0;
            (data->set).postfields = (void *)0x0;
          }
        }
      }
      else if (CVar12 == CURLOPT_MAX_SEND_SPEED_LARGE) {
        if (lVar22 < 0) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pcVar29 = &(data->set).max_send_speed;
      }
      else if (CVar12 == CURLOPT_MAX_RECV_SPEED_LARGE) {
        if (lVar22 < 0) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pcVar29 = &(data->set).max_recv_speed;
      }
      else {
        if (CVar12 != CURLOPT_TIMEVALUE_LARGE) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar29 = &(data->set).timevalue;
      }
      *pcVar29 = lVar22;
      goto switchD_00151aed_caseD_5b;
    }
    if (uVar11 < 0x29) {
      puVar15 = (undefined8 *)((ulong)uVar11 + (long)param->reg_save_area);
      param->gp_offset = uVar11 + 8;
    }
    else {
      puVar15 = (undefined8 *)param->overflow_arg_area;
      param->overflow_arg_area = puVar15 + 1;
    }
    CVar28 = CURLE_UNKNOWN_OPTION;
    if (0x13 < option - CURLOPT_SSLCERT_BLOB) {
      return CURLE_UNKNOWN_OPTION;
    }
    blob = (curl_blob *)*puVar15;
    switch(option) {
    case CURLOPT_SSLCERT_BLOB:
      lVar22 = 0x928;
      break;
    case CURLOPT_SSLKEY_BLOB:
      lVar22 = 0x930;
      break;
    case CURLOPT_PROXY_SSLCERT_BLOB:
      lVar22 = 0x948;
      break;
    case CURLOPT_PROXY_SSLKEY_BLOB:
      lVar22 = 0x950;
      break;
    case CURLOPT_ISSUERCERT_BLOB:
      lVar22 = 0x938;
      break;
    default:
      goto switchD_00151aed_caseD_ef;
    case CURLOPT_PROXY_ISSUERCERT_BLOB:
      lVar22 = 0x958;
      break;
    case CURLOPT_CAINFO_BLOB:
      _Var7 = Curl_ssl_supports(data,0x40);
      lVar22 = 0x940;
      goto LAB_001523c3;
    case CURLOPT_PROXY_CAINFO_BLOB:
      _Var7 = Curl_ssl_supports(data,0x40);
      lVar22 = 0x960;
LAB_001523c3:
      CVar28 = CURLE_NOT_BUILT_IN;
      if (_Var7 != false) break;
      goto switchD_00151aed_caseD_ef;
    }
    CVar28 = Curl_setblobopt((curl_blob **)((long)&data->magic + lVar22),blob);
    return CVar28;
  }
  uVar11 = param->gp_offset;
  if ((ulong)uVar11 < 0x29) {
    puVar13 = (ulong *)((ulong)uVar11 + (long)param->reg_save_area);
    param->gp_offset = uVar11 + 8;
  }
  else {
    puVar13 = (ulong *)param->overflow_arg_area;
    param->overflow_arg_area = puVar13 + 1;
  }
  uVar23 = *puVar13;
  uVar21 = (ushort)uVar23;
  CVar28 = CURLE_NOT_BUILT_IN;
  bVar8 = (byte)uVar23;
  uVar11 = (uint)uVar23;
  switch(option) {
  case CURLOPT_TIMEOUT:
    if (0x20c49b < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).timeout = uVar11 * 1000;
    break;
  case CURLOPT_INFILESIZE:
    if ((long)uVar23 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).filesize = uVar23;
    break;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x16:
  case CURLOPT_LOW_SPEED_TIME|CURLOPT_PORT:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x31:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3e:
  case CURLOPT_POSTFIELDSIZE|CURLOPT_PORT:
  case 0x41:
  case 0x42:
  case CURLOPT_SSL_VERIFYPEER|CURLOPT_PORT:
  case 0x46:
  case 0x48:
  case 0x49:
  case 0x4c:
  case CURLOPT_SSL_VERIFYPEER|CURLOPT_TIMEOUT:
  case 0x4f:
  case 0x52:
  case CURLOPT_HTTPGET|CURLOPT_PORT:
  case 0x56:
  case CURLOPT_HTTP_VERSION|CURLOPT_PORT:
  case 0x58:
  case 0x59:
  case 0x5d:
  case 0x5e:
  case CURLOPT_DNS_CACHE_TIMEOUT|CURLOPT_PORT:
  case 0x61:
  case 100:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6c:
  case CURLOPT_COOKIESESSION|CURLOPT_TIMEOUT:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x78:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case CURLOPT_SERVER_RESPONSE_TIMEOUT|CURLOPT_TIMEOUT:
  case CURLOPT_SERVER_RESPONSE_TIMEOUT|CURLOPT_INFILESIZE:
  case 0x7f:
  case 0x80:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x8e:
  case CURLOPT_LOCALPORTRANGE|CURLOPT_PORT:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case CURLOPT_SSH_AUTH_TYPES:
  case 0x98:
  case 0x99:
  case CURLOPT_NEW_DIRECTORY_PERMS:
  case 0xa2:
  case CURLOPT_NEW_DIRECTORY_PERMS|CURLOPT_PORT:
  case 0xa4:
  case 0xa5:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xad:
  case 0xae:
  case CURLOPT_CERTINFO|CURLOPT_PORT:
  case 0xb0:
  case 0xb1:
  case 0xb3:
  case CURLOPT_SOCKS5_GSSAPI_NEC:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case CURLOPT_NEW_DIRECTORY_PERMS|CURLOPT_CRLF:
  case 0xbe:
  case CURLOPT_FTP_USE_PRET|CURLOPT_PORT:
  case 0xc0:
  case 0xc3:
  case 0xc4:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xd0:
  case 0xd1:
  case CURLOPT_GSSAPI_DELEGATION:
  case 0xd3:
  case 0xd9:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe0:
  case 0xe4:
  case 0xe6:
  case 0xe7:
  case 0xeb:
  case 0xec:
  case 0xee:
  case 0xf0:
  case 0xf1:
  case 0xf3:
  case 0xf6:
  case CURLOPT_TCP_FASTOPEN|CURLOPT_PORT:
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
  case 0x100:
  case 0x101:
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x106:
  case 0x107:
  case 0x108:
  case 0x10a:
  case CURLOPT_SSH_COMPRESSION:
  case 0x10d:
  case 0x10e:
  case 0x110:
  case 0x111:
  case 0x114:
  case 0x115:
  case 0x117:
  case 0x11a:
  case CURLOPT_UPLOAD_BUFFERSIZE|CURLOPT_PORT:
  case 0x11c:
  case 0x11f:
  case 0x121:
  case 0x123:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 0x12a:
  case 300:
  case CURLOPT_MAXAGE_CONN|CURLOPT_TIMEOUT:
  case CURLOPT_MAXAGE_CONN|CURLOPT_INFILESIZE:
  case 0x12f:
  case 0x130:
  case 0x131:
  case 0x135:
  case 0x136:
  case CURLOPT_DOH_SSL_VERIFYSTATUS|CURLOPT_PORT:
  case 0x138:
  case 0x139:
  case 0x13c:
  case 0x13d:
  case 0x13e:
  case 0x13f:
  case 0x143:
  case 0x145:
    return CURLE_UNKNOWN_OPTION;
  case CURLOPT_LOW_SPEED_LIMIT:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).low_speed_limit = uVar23;
    break;
  case CURLOPT_LOW_SPEED_TIME:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).low_speed_time = uVar23;
    break;
  case CURLOPT_RESUME_FROM:
    if ((long)uVar23 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).set_resume_from = uVar23;
    break;
  case CURLOPT_CRLF:
    uVar17 = (ulong)(uVar23 != 0) << 8;
    uVar23 = 0xfffffffffffffeff;
    goto LAB_00153336;
  case CURLOPT_SSLVERSION:
  case CURLOPT_PROXY_SSLVERSION:
    if (0x7ffff < (uVar11 & 0xffff0000)) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if ((uVar11 & 0xfffe) == 2) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if ((uVar23 & 0xfff8) != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    psVar27 = &(data->set).ssl;
    if (option != CURLOPT_SSLVERSION) {
      psVar27 = &(data->set).proxy_ssl;
    }
    (psVar27->primary).version = bVar8;
    (psVar27->primary).version_max = uVar11 & 0xffff0000;
    break;
  case CURLOPT_TIMECONDITION:
    if (3 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).timecondition = bVar8;
    break;
  case CURLOPT_TIMEVALUE:
    (data->set).timevalue = uVar23;
    break;
  case CURLOPT_VERBOSE:
    uVar17 = (ulong)((uint)(uVar23 != 0) << 0x1e);
    uVar23 = 0xffffffffbfffffff;
    goto LAB_00153336;
  case CURLOPT_HEADER:
    uVar17 = (ulong)((uint)(uVar23 != 0) << 0x1a);
    uVar23 = 0xfffffffffbffffff;
    goto LAB_00153336;
  case CURLOPT_NOPROGRESS:
    *(ulong *)&(data->set).field_0x894 =
         *(ulong *)&(data->set).field_0x894 & 0xffffffffffdfffff | (ulong)(uVar23 != 0) << 0x15;
    uVar11 = (data->progress).flags;
    if (uVar23 == 0) {
      uVar11 = uVar11 & 0xffffffef;
    }
    else {
      uVar11 = uVar11 | 0x10;
    }
    (data->progress).flags = uVar11;
    break;
  case CURLOPT_NOBODY:
    *(ulong *)&(data->set).field_0x894 =
         *(ulong *)&(data->set).field_0x894 & 0xffffffffdfffffff |
         (ulong)((uint)(uVar23 != 0) << 0x1d);
    if (uVar23 == 0) {
      if ((data->set).method == '\x05') goto LAB_0015362c;
    }
    else {
      (data->set).method = '\x05';
    }
    break;
  case CURLOPT_FAILONERROR:
    uVar17 = (ulong)(uVar23 != 0) << 0x16;
    uVar23 = 0xffffffffffbfffff;
    goto LAB_00153336;
  case CURLOPT_UPLOAD:
  case CURLOPT_PUT:
    if (uVar23 == 0) goto LAB_0015362c;
    (data->set).method = '\x04';
LAB_00152ce2:
    puVar1 = &(data->set).field_0x897;
    *puVar1 = *puVar1 & 0xdf;
    break;
  case CURLOPT_POST:
    if (uVar23 != 0) {
      (data->set).method = '\x01';
      goto LAB_00152ce2;
    }
LAB_0015362c:
    (data->set).method = '\0';
    break;
  case CURLOPT_DIRLISTONLY:
    uVar17 = (ulong)(uVar23 != 0) << 0xe;
    uVar23 = 0xffffffffffffbfff;
    goto LAB_00153336;
  case CURLOPT_APPEND:
    uVar17 = (ulong)(uVar23 != 0) << 0xd;
    uVar23 = 0xffffffffffffdfff;
    goto LAB_00153336;
  case CURLOPT_NETRC:
    if (2 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).use_netrc = bVar8;
    break;
  case CURLOPT_FOLLOWLOCATION:
    if (3 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).http_follow_mode = bVar8;
    break;
  case CURLOPT_TRANSFERTEXT:
    uVar17 = (ulong)(uVar23 != 0) << 0xc;
    uVar23 = 0xffffffffffffefff;
    goto LAB_00153336;
  case CURLOPT_AUTOREFERER:
    uVar17 = (ulong)((uint)(uVar23 != 0) << 0x1c);
    uVar23 = 0xffffffffefffffff;
    goto LAB_00153336;
  case CURLOPT_PROXYPORT:
    if (0xffff < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).proxyport = uVar21;
    break;
  case CURLOPT_POSTFIELDSIZE:
    if ((long)uVar23 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if (((data->set).postfieldsize < (long)uVar23) &&
       (pcVar5 = (data->set).str[0x49], (char *)(data->set).postfields == pcVar5)) {
      (*Curl_cfree)(pcVar5);
      (data->set).str[0x49] = (char *)0x0;
      (data->set).postfields = (void *)0x0;
    }
    (data->set).postfieldsize = uVar23;
    break;
  case CURLOPT_HTTPPROXYTUNNEL:
    uVar17 = (ulong)(uVar23 != 0) << 0xb;
    uVar23 = 0xfffffffffffff7ff;
    goto LAB_00153336;
  case CURLOPT_SSL_VERIFYPEER:
    bVar8 = uVar23 != 0;
    bVar20 = (data->set).ssl.primary.field_0x79 & 0xfe;
    goto LAB_00152a6b;
  case CURLOPT_MAXREDIRS:
    if ((long)uVar23 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxredirs = uVar23;
    break;
  case CURLOPT_FILETIME:
    uVar17 = (ulong)(uVar23 != 0) << 10;
    uVar23 = 0xfffffffffffffbff;
    goto LAB_00153336;
  case CURLOPT_MAXCONNECTS:
    if (uVar23 >> 0x20 != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxconnects = uVar11;
    break;
  case CURLOPT_FRESH_CONNECT:
    uVar17 = (ulong)(uVar23 != 0) << 0x20;
    uVar23 = 0xfffffffeffffffff;
    goto LAB_00153336;
  case CURLOPT_FORBID_REUSE:
    uVar17 = (ulong)((uint)(uVar23 != 0) << 0x1f);
    uVar23 = 0xffffffff7fffffff;
    goto LAB_00153336;
  case CURLOPT_CONNECTTIMEOUT:
    if (0x20c49b < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).connecttimeout = uVar11 * 1000;
    break;
  case CURLOPT_HTTPGET:
    if (uVar23 != 0) {
      (data->set).method = '\0';
      goto LAB_00152ce2;
    }
    break;
  case CURLOPT_SSL_VERIFYHOST:
    bVar8 = (uVar23 != 0) * '\x02';
    bVar20 = (data->set).ssl.primary.field_0x79 & 0xfd;
    goto LAB_00152a6b;
  case CURLOPT_HTTP_VERSION:
    if (2 < uVar23) {
      if ((long)uVar23 < 0) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    (data->set).httpwant = bVar8;
    break;
  case CURLOPT_FTP_USE_EPSV:
    uVar17 = (ulong)(uVar23 != 0) << 0x10;
    uVar23 = 0xfffffffffffeffff;
    goto LAB_00153336;
  case CURLOPT_SSLENGINE_DEFAULT:
    (*Curl_cfree)((data->set).str[0x2c]);
    (data->set).str[0x2c] = (char *)0x0;
    CVar28 = Curl_ssl_set_engine_default(data);
    return CVar28;
  case CURLOPT_DNS_USE_GLOBAL_CACHE:
  case CURLOPT_SSL_ENABLE_NPN:
    break;
  case CURLOPT_DNS_CACHE_TIMEOUT:
    if ((long)uVar23 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar17 = 0x7fffffff;
    if ((long)uVar23 < 0x7fffffff) {
      uVar17 = uVar23;
    }
    (data->set).dns_cache_timeout = (int)uVar17;
    break;
  case CURLOPT_COOKIESESSION:
    uVar17 = (ulong)(uVar23 != 0) << 7;
    uVar23 = 0xffffffffffffff7f;
    goto LAB_00153336;
  case CURLOPT_BUFFERSIZE:
    uVar11 = 0xa00000;
    if ((long)uVar23 < 0xa00001) {
      if ((long)uVar23 < 1) {
        uVar11 = 0x4000;
      }
      else {
        uVar17 = 0x400;
        if (0x400 < uVar23) {
          uVar17 = uVar23;
        }
        uVar11 = (uint)uVar17;
      }
    }
    (data->set).buffer_size = uVar11;
    break;
  case CURLOPT_NOSIGNAL:
    uVar17 = (ulong)(uVar23 != 0) << 0x21;
    uVar23 = 0xfffffffdffffffff;
    goto LAB_00153336;
  case CURLOPT_PROXYTYPE:
    if (7 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).proxytype = bVar8;
    break;
  case CURLOPT_UNRESTRICTED_AUTH:
    uVar17 = (ulong)((uint)(uVar23 != 0) << 0x19);
    uVar23 = 0xfffffffffdffffff;
    goto LAB_00153336;
  case CURLOPT_FTP_USE_EPRT:
    uVar17 = (ulong)(uVar23 != 0) << 0x11;
    uVar23 = 0xfffffffffffdffff;
    goto LAB_00153336;
  case CURLOPT_HTTPAUTH:
    _Var7 = false;
    goto LAB_00152887;
  case CURLOPT_FTP_CREATE_MISSING_DIRS:
    if (2 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftp_create_missing_dirs = bVar8;
    break;
  case CURLOPT_PROXYAUTH:
    _Var7 = true;
LAB_00152887:
    CVar28 = httpauth(data,_Var7,uVar23);
    return CVar28;
  case CURLOPT_SERVER_RESPONSE_TIMEOUT:
    if (0x20c49b < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).server_response_timeout = uVar11 * 1000;
    break;
  case CURLOPT_IPRESOLVE:
    if (2 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ipver = bVar8;
    break;
  case CURLOPT_MAXFILESIZE:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).max_filesize = uVar23;
    break;
  case CURLOPT_USE_SSL:
    if (3 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).use_ssl = bVar8;
    break;
  case CURLOPT_TCP_NODELAY:
    uVar17 = (ulong)(uVar23 != 0) << 0x22;
    uVar23 = 0xfffffffbffffffff;
    goto LAB_00153336;
  case CURLOPT_FTPSSLAUTH:
    if (2 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftpsslauth = bVar8;
    break;
  case CURLOPT_IGNORE_CONTENT_LENGTH:
    uVar17 = (ulong)(uVar23 != 0) << 0x23;
    uVar23 = 0xfffffff7ffffffff;
    goto LAB_00153336;
  case CURLOPT_FTP_SKIP_PASV_IP:
    uVar17 = (ulong)(uVar23 != 0) << 0x13;
    uVar23 = 0xfffffffffff7ffff;
    goto LAB_00153336;
  case CURLOPT_FTP_FILEMETHOD:
    if (3 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftp_filemethod = bVar8;
    break;
  case CURLOPT_LOCALPORT:
    if (0xffff < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar10 = curlx_sltous(uVar23);
    (data->set).localport = uVar10;
    break;
  case CURLOPT_LOCALPORTRANGE:
    if (0xffff < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar10 = curlx_sltous(uVar23);
    (data->set).localportrange = uVar10;
    break;
  case CURLOPT_CONNECT_ONLY:
    if (2 < (long)uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar17 = (ulong)(uVar23 != 0) + (ulong)(uVar23 == 2) * 2 |
             *(ulong *)&(data->set).field_0x894 & 0xfffffffffffffffc;
    goto LAB_001534f6;
  case CURLOPT_SSL_SESSIONID_CACHE:
    bVar20 = (uVar23 != 0) << 3;
    bVar8 = (data->set).proxy_ssl.primary.field_0x79;
    (data->set).ssl.primary.field_0x79 = (data->set).ssl.primary.field_0x79 & 0xf7 | bVar20;
    (data->set).proxy_ssl.primary.field_0x79 = bVar8 & 0xf7 | bVar20;
    break;
  case CURLOPT_FTP_SSL_CCC:
    if (2 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftp_ccc = bVar8;
    break;
  case CURLOPT_TIMEOUT_MS:
    uVar17 = 0xffffffff;
    if (uVar23 < 0xffffffff) {
      uVar17 = uVar23;
    }
    (data->set).timeout = (uint)uVar17;
    break;
  case CURLOPT_CONNECTTIMEOUT_MS:
    uVar17 = 0xffffffff;
    if (uVar23 < 0xffffffff) {
      uVar17 = uVar23;
    }
    (data->set).connecttimeout = (uint)uVar17;
    break;
  case CURLOPT_HTTP_TRANSFER_DECODING:
    uVar17 = (ulong)(uVar23 == 0) << 0x24;
    uVar23 = 0xffffffefffffffff;
    goto LAB_00153336;
  case CURLOPT_HTTP_CONTENT_DECODING:
    uVar17 = (ulong)(uVar23 == 0) << 0x25;
    uVar23 = 0xffffffdfffffffff;
    goto LAB_00153336;
  case CURLOPT_NEW_FILE_PERMS:
    if (0x1ff < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).new_file_perms = uVar11;
    break;
  case CURLOPT_POSTREDIR:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).keep_post = bVar8 & 7;
    break;
  case CURLOPT_PROXY_TRANSFER_MODE:
    if (1 < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar23 = uVar23 << 0x26;
    uVar17 = 0xffffffbfffffffff;
    goto LAB_00153311;
  case CURLOPT_ADDRESS_SCOPE:
    if (uVar23 >> 0x20 != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).scope_id = uVar11;
    break;
  case CURLOPT_CERTINFO:
    _Var7 = Curl_ssl_supports(data,2);
    if (!_Var7) {
      return CURLE_NOT_BUILT_IN;
    }
    uVar9 = (ushort)(uVar23 != 0);
    uVar21 = (ushort)*(undefined4 *)&(data->set).ssl.field_0xc0 & 0xfffe;
    goto LAB_00153026;
  case CURLOPT_TFTP_BLKSIZE:
    uVar17 = 0xffb8;
    if (uVar23 < 0xffb8) {
      uVar17 = uVar23;
    }
    uVar24 = 0x200;
    if (7 < (long)uVar23) {
      uVar24 = uVar17;
    }
    (data->set).tftp_blksize = uVar24;
    break;
  case CURLOPT_PROTOCOLS:
    (data->set).allowed_protocols = uVar11;
    break;
  case CURLOPT_REDIR_PROTOCOLS:
    (data->set).redir_protocols = uVar11;
    break;
  case CURLOPT_FTP_USE_PRET:
    uVar17 = (ulong)(uVar23 != 0) << 0x12;
    uVar23 = 0xfffffffffffbffff;
    goto LAB_00153336;
  case CURLOPT_RTSP_REQUEST:
    if (10 < uVar23 - 1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).rtspreq = (int)(uVar23 - 1) + RTSPREQ_OPTIONS;
    break;
  case CURLOPT_RTSP_CLIENT_CSEQ:
    (data->state).rtsp_next_client_CSeq = uVar23;
    break;
  case CURLOPT_RTSP_SERVER_CSEQ:
    (data->state).rtsp_next_server_CSeq = uVar23;
    break;
  case CURLOPT_WILDCARDMATCH:
    uVar17 = (ulong)(uVar23 != 0) << 0x14;
    uVar23 = 0xffffffffffefffff;
    goto LAB_00153336;
  case CURLOPT_TRANSFER_ENCODING:
    uVar17 = (ulong)(uVar23 != 0) << 0x18;
    uVar23 = 0xfffffffffeffffff;
    goto LAB_00153336;
  case CURLOPT_ACCEPTTIMEOUT_MS:
    uVar17 = 0xffffffff;
    if (uVar23 < 0xffffffff) {
      uVar17 = uVar23;
    }
    (data->set).accepttimeout = (uint)uVar17;
    break;
  case CURLOPT_TCP_KEEPALIVE:
    uVar17 = (ulong)(uVar23 != 0) << 0x28;
    uVar23 = 0xfffffeffffffffff;
    goto LAB_00153336;
  case CURLOPT_TCP_KEEPIDLE:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar17 = 0x7fffffff;
    if (uVar23 < 0x7fffffff) {
      uVar17 = uVar23;
    }
    (data->set).tcp_keepidle = (int)uVar17;
    break;
  case CURLOPT_TCP_KEEPINTVL:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar17 = 0x7fffffff;
    if (uVar23 < 0x7fffffff) {
      uVar17 = uVar23;
    }
    (data->set).tcp_keepintvl = (int)uVar17;
    break;
  case CURLOPT_SSL_OPTIONS:
    (data->set).ssl.primary.ssl_options = bVar8;
    uVar9 = (ushort)*(undefined4 *)&(data->set).ssl.field_0xc0 & 0xfe03;
    uVar21 = ((ushort)(uVar23 >> 4) & 4) + (uVar21 & 0x3f) * 8;
LAB_00153026:
    *(ushort *)&(data->set).ssl.field_0xc0 = uVar21 | uVar9;
    break;
  case CURLOPT_SASL_IR:
    uVar17 = (ulong)(uVar23 != 0) << 0x27;
    uVar23 = 0xffffff7fffffffff;
    goto LAB_00153336;
  case CURLOPT_SSL_ENABLE_ALPN:
    uVar17 = (ulong)(uVar23 != 0) << 0x2a;
    uVar23 = 0xfffffbffffffffff;
    goto LAB_00153336;
  case CURLOPT_EXPECT_100_TIMEOUT_MS:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).expect_100_timeout = uVar23;
    break;
  case CURLOPT_HEADEROPT:
    uVar23 = (ulong)((uVar11 & 1) << 6);
    uVar17 = *(ulong *)&(data->set).field_0x894 & 0xffffffffffffffbf;
    goto LAB_00153318;
  case CURLOPT_SSL_VERIFYSTATUS:
    _Var7 = Curl_ssl_cert_status_request();
    if (!_Var7) {
      return CURLE_NOT_BUILT_IN;
    }
    bVar8 = (uVar23 != 0) << 2;
    bVar20 = (data->set).ssl.primary.field_0x79 & 0xfb;
LAB_00152a6b:
    (data->set).ssl.primary.field_0x79 = bVar20 | bVar8;
    _Var7 = false;
LAB_00153141:
    Curl_ssl_conn_config_update(data,_Var7);
    break;
  case CURLOPT_SSL_FALSESTART:
    _Var7 = Curl_ssl_false_start();
    if (!_Var7) {
      return CURLE_NOT_BUILT_IN;
    }
    *(ushort *)&(data->set).ssl.field_0xc0 =
         ((ushort)*(undefined4 *)&(data->set).ssl.field_0xc0 & 0xfffd) + (ushort)(uVar23 != 0) * 2;
    break;
  case CURLOPT_PATH_AS_IS:
    uVar17 = (ulong)(uVar23 != 0) << 0x2b;
    uVar23 = 0xfffff7ffffffffff;
    goto LAB_00153336;
  case CURLOPT_PIPEWAIT:
    uVar17 = (ulong)(uVar23 != 0) << 0x2c;
    uVar23 = 0xffffefffffffffff;
    goto LAB_00153336;
  case CURLOPT_STREAM_WEIGHT:
    goto switchD_00151aed_caseD_ef;
  case CURLOPT_TFTP_NO_OPTIONS:
    uVar17 = (ulong)(uVar23 != 0) << 5;
    uVar23 = *(ulong *)&(data->set).field_0x894 & 0xffffffffffffffdf;
    goto LAB_0015333d;
  case CURLOPT_TCP_FASTOPEN:
    uVar17 = (ulong)(uVar23 != 0) << 0x29;
    uVar23 = 0xfffffdffffffffff;
    goto LAB_00153336;
  case CURLOPT_KEEP_SENDING_ON_ERROR:
    uVar17 = (ulong)(uVar23 != 0) << 0x17;
    uVar23 = 0xffffffffff7fffff;
    goto LAB_00153336;
  case CURLOPT_PROXY_SSL_VERIFYPEER:
    bVar8 = uVar23 != 0;
    bVar20 = (data->set).proxy_ssl.primary.field_0x79 & 0xfe;
    goto LAB_00153131;
  case CURLOPT_PROXY_SSL_VERIFYHOST:
    bVar8 = (uVar23 != 0) * '\x02';
    bVar20 = (data->set).proxy_ssl.primary.field_0x79 & 0xfd;
LAB_00153131:
    (data->set).proxy_ssl.primary.field_0x79 = bVar20 | bVar8;
    _Var7 = true;
    goto LAB_00153141;
  case CURLOPT_PROXY_SSL_OPTIONS:
    (data->set).proxy_ssl.primary.ssl_options = bVar8;
    *(ushort *)&(data->set).proxy_ssl.field_0xc0 =
         ((ushort)*(undefined4 *)&(data->set).proxy_ssl.field_0xc0 & 0xfe07) + (uVar21 & 0x3f) * 8;
    break;
  case CURLOPT_SUPPRESS_CONNECT_HEADERS:
    uVar17 = (ulong)(uVar23 != 0) << 0x2d;
    uVar23 = 0xffffdfffffffffff;
    goto LAB_00153336;
  case CURLOPT_SOCKS5_AUTH:
    if ((uVar23 & 0xfffffffffffffffa) != 0) {
      return CURLE_NOT_BUILT_IN;
    }
    (data->set).socks5auth = bVar8;
    break;
  case CURLOPT_HAPPY_EYEBALLS_TIMEOUT_MS:
    uVar17 = 0xffffffff;
    if (uVar23 < 0xffffffff) {
      uVar17 = uVar23;
    }
    (data->set).happy_eyeballs_timeout = (uint)uVar17;
    break;
  case CURLOPT_HAPROXYPROTOCOL:
    uVar17 = (ulong)(uVar23 != 0) << 0x2f;
    uVar23 = 0xffff7fffffffffff;
    goto LAB_00153336;
  case CURLOPT_DNS_SHUFFLE_ADDRESSES:
    uVar17 = (ulong)(uVar23 != 0) << 0x2e;
    uVar23 = 0xffffbfffffffffff;
    goto LAB_00153336;
  case CURLOPT_DISALLOW_USERNAME_IN_URL:
    uVar17 = (ulong)(uVar23 != 0) << 0x31;
    uVar23 = 0xfffdffffffffffff;
    goto LAB_00153336;
  case CURLOPT_UPLOAD_BUFFERSIZE:
    uVar17 = 0x4000;
    if (0x4000 < (long)uVar23) {
      uVar17 = uVar23;
    }
    if (0x1fffff < (long)uVar17) {
      uVar17 = 0x200000;
    }
    (data->set).upload_buffer_size = (uint)uVar17;
    break;
  case CURLOPT_UPKEEP_INTERVAL_MS:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).upkeep_interval_ms = uVar23;
    break;
  case CURLOPT_HTTP09_ALLOWED:
    uVar17 = (ulong)(uVar23 != 0) << 0x36;
    uVar23 = 0xffbfffffffffffff;
    goto LAB_00153336;
  case CURLOPT_ALTSVC_CTRL:
    if (uVar23 == 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    asi = data->asi;
    if (asi == (altsvcinfo *)0x0) {
      asi = Curl_altsvc_init();
      data->asi = asi;
      if (asi == (altsvcinfo *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    CVar28 = Curl_altsvc_ctrl(asi,uVar23);
    return CVar28;
  case CURLOPT_MAXAGE_CONN:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxage_conn = uVar23;
    break;
  case CURLOPT_MAIL_RCPT_ALLOWFAILS:
    uVar17 = (*(ulong *)&(data->set).field_0x894 & 0xfffffffffffffffb) + (ulong)(uVar23 != 0) * 4;
    goto LAB_001534f6;
  case CURLOPT_HSTS_CTRL:
    hp = &data->hsts;
    if ((uVar23 & 1) == 0) {
      Curl_hsts_cleanup(hp);
    }
    else if (*hp == (hsts *)0x0) {
      phVar19 = Curl_hsts_init();
      *hp = phVar19;
      if (phVar19 == (hsts *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    break;
  case CURLOPT_DOH_SSL_VERIFYPEER:
    uVar17 = (ulong)(uVar23 != 0) << 0x33;
    uVar23 = 0xfff7ffffffffffff;
    goto LAB_00153336;
  case CURLOPT_DOH_SSL_VERIFYHOST:
    uVar17 = (ulong)(uVar23 != 0) << 0x34;
    uVar23 = 0xffefffffffffffff;
    goto LAB_00153336;
  case CURLOPT_DOH_SSL_VERIFYSTATUS:
    _Var7 = Curl_ssl_cert_status_request();
    if (!_Var7) {
      return CURLE_NOT_BUILT_IN;
    }
    uVar17 = (ulong)(uVar23 != 0) << 0x35;
    uVar23 = 0xffdfffffffffffff;
    goto LAB_00153336;
  case CURLOPT_MAXLIFETIME_CONN:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxlifetime_conn = uVar23;
    break;
  case CURLOPT_MIME_OPTIONS:
    uVar17 = (*(ulong *)&(data->set).field_0x894 & 0xfffffffffffffff7) + (ulong)(uVar11 & 1) * 8;
    goto LAB_001534f6;
  case CURLOPT_WS_OPTIONS:
    uVar23 = (ulong)(uVar11 & 1) << 0x37;
    uVar17 = 0xff7fffffffffffff;
LAB_00153311:
    uVar17 = uVar17 & *(ulong *)&(data->set).field_0x894;
LAB_00153318:
    uVar17 = uVar17 | uVar23;
LAB_001534f6:
    *(ulong *)&(data->set).field_0x894 = uVar17;
    break;
  case CURLOPT_CA_CACHE_TIMEOUT:
    _Var7 = Curl_ssl_supports(data,0x100);
    if (!_Var7) {
      return CURLE_NOT_BUILT_IN;
    }
    if ((long)uVar23 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar17 = 0x7fffffff;
    if ((long)uVar23 < 0x7fffffff) {
      uVar17 = uVar23;
    }
    (data->set).general_ssl.ca_cache_timeout = (int)uVar17;
    break;
  case CURLOPT_QUICK_EXIT:
    uVar17 = (ulong)(uVar23 != 0) << 9;
    uVar23 = 0xfffffffffffffdff;
LAB_00153336:
    uVar23 = uVar23 & *(ulong *)&(data->set).field_0x894;
LAB_0015333d:
    *(ulong *)&(data->set).field_0x894 = uVar23 | uVar17;
    break;
  case CURLOPT_SERVER_RESPONSE_TIMEOUT_MS:
    if (0x7fffffff < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).server_response_timeout = uVar11;
    break;
  case CURLOPT_TCP_KEEPCNT:
    if ((long)uVar23 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar17 = 0x7fffffff;
    if (uVar23 < 0x7fffffff) {
      uVar17 = uVar23;
    }
    (data->set).tcp_keepcnt = (int)uVar17;
    break;
  case CURLOPT_UPLOAD_FLAGS:
    (data->set).upload_flags = bVar8;
    break;
  default:
    if (option != CURLOPT_PORT) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (0xffff < uVar23) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).use_port = uVar21;
  }
switchD_00151aed_caseD_5b:
  CVar28 = CURLE_OK;
switchD_00151aed_caseD_ef:
  return CVar28;
}

Assistant:

CURLcode Curl_vsetopt(struct Curl_easy *data, CURLoption option, va_list param)
{
  if(option < CURLOPTTYPE_OBJECTPOINT)
    return setopt_long(data, option, va_arg(param, long));
  else if(option < CURLOPTTYPE_FUNCTIONPOINT) {
    /* unfortunately, different pointer types cannot be identified any other
       way than being listed explicitly */
    switch(option) {
    case CURLOPT_HTTPHEADER:
    case CURLOPT_QUOTE:
    case CURLOPT_POSTQUOTE:
    case CURLOPT_TELNETOPTIONS:
    case CURLOPT_PREQUOTE:
    case CURLOPT_HTTP200ALIASES:
    case CURLOPT_MAIL_RCPT:
    case CURLOPT_RESOLVE:
    case CURLOPT_PROXYHEADER:
    case CURLOPT_CONNECT_TO:
      return setopt_slist(data, option, va_arg(param, struct curl_slist *));
    case CURLOPT_HTTPPOST:         /* curl_httppost * */
    case CURLOPT_MIMEPOST:         /* curl_mime * */
    case CURLOPT_STDERR:           /* FILE * */
    case CURLOPT_SHARE:            /* CURLSH * */
    case CURLOPT_STREAM_DEPENDS:   /* CURL * */
    case CURLOPT_STREAM_DEPENDS_E: /* CURL * */
      return setopt_pointers(data, option, param);
    default:
      break;
    }
    /* the char pointer options */
    return setopt_cptr(data, option, va_arg(param, char *));
  }
  else if(option < CURLOPTTYPE_OFF_T)
    return setopt_func(data, option, param);
  else if(option < CURLOPTTYPE_BLOB)
    return setopt_offt(data, option, va_arg(param, curl_off_t));
  return setopt_blob(data, option, va_arg(param, struct curl_blob *));
}